

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiPayload * ImGui::AcceptDragDropPayload(char *type,ImGuiDragDropFlags flags)

{
  ImGuiPayload *this;
  ImGuiID IVar1;
  ImGuiID IVar2;
  ImGuiWindow *pIVar3;
  ImDrawList *this_00;
  ImVec2 cr_min;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImU32 col;
  float fVar6;
  ImVec2 cr_max;
  ImRect local_48;
  uint local_34;
  
  pIVar4 = GImGui;
  if (GImGui->DragDropActive == false) {
    __assert_fail("g.DragDropActive",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x2858,
                  "const ImGuiPayload *ImGui::AcceptDragDropPayload(const char *, ImGuiDragDropFlags)"
                 );
  }
  if ((GImGui->DragDropPayload).DataFrameCount != -1) {
    pIVar3 = GImGui->CurrentWindow;
    this = &GImGui->DragDropPayload;
    if ((type == (char *)0x0) || (bVar5 = ImGuiPayload::IsDataType(this,type), bVar5)) {
      IVar1 = pIVar4->DragDropTargetId;
      IVar2 = pIVar4->DragDropAcceptIdPrev;
      local_48.Min = (pIVar4->DragDropTargetRect).Min;
      local_48.Max = (pIVar4->DragDropTargetRect).Max;
      fVar6 = (local_48.Max.y - local_48.Min.y) * (local_48.Max.x - local_48.Min.x);
      if (fVar6 <= pIVar4->DragDropAcceptIdCurrRectSurface) {
        pIVar4->DragDropAcceptFlags = flags;
        pIVar4->DragDropAcceptIdCurr = IVar1;
        pIVar4->DragDropAcceptIdCurrRectSurface = fVar6;
      }
      (pIVar4->DragDropPayload).Preview = IVar2 == IVar1;
      if (((pIVar4->DragDropSourceFlags | flags) & 0x800U) == 0 && IVar2 == IVar1) {
        local_48.Min.y = local_48.Min.y + -3.5;
        local_48.Min.x = local_48.Min.x + -3.5;
        local_48.Max.y = local_48.Max.y + 3.5;
        local_48.Max.x = local_48.Max.x + 3.5;
        local_34 = flags;
        bVar5 = ImRect::Contains(&pIVar3->ClipRect,&local_48);
        if (!bVar5) {
          cr_max.x = local_48.Max.x + 1.0;
          cr_max.y = local_48.Max.y + 1.0;
          cr_min.y = local_48.Min.y + -1.0;
          cr_min.x = local_48.Min.x + -1.0;
          ImDrawList::PushClipRect(pIVar3->DrawList,cr_min,cr_max,false);
        }
        this_00 = pIVar3->DrawList;
        col = GetColorU32(0x2d,1.0);
        ImDrawList::AddRect(this_00,&local_48.Min,&local_48.Max,col,0.0,-1,2.0);
        flags = local_34;
        if (!bVar5) {
          ImDrawList::PopClipRect(pIVar3->DrawList);
        }
      }
      pIVar4->DragDropAcceptFrameCount = pIVar4->FrameCount;
      if (IVar2 == IVar1) {
        bVar5 = IsMouseDown(pIVar4->DragDropMouseButton);
        (pIVar4->DragDropPayload).Delivery = !bVar5;
        if (((uint)flags >> 10 & 1) != 0 || !bVar5) {
          return this;
        }
      }
      else {
        (pIVar4->DragDropPayload).Delivery = false;
        if (((uint)flags >> 10 & 1) != 0) {
          return this;
        }
      }
    }
    return (ImGuiPayload *)0x0;
  }
  __assert_fail("payload.DataFrameCount != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0x2859,
                "const ImGuiPayload *ImGui::AcceptDragDropPayload(const char *, ImGuiDragDropFlags)"
               );
}

Assistant:

const ImGuiPayload* ImGui::AcceptDragDropPayload(const char* type, ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiPayload& payload = g.DragDropPayload;
    IM_ASSERT(g.DragDropActive);                        // Not called between BeginDragDropTarget() and EndDragDropTarget() ?
    IM_ASSERT(payload.DataFrameCount != -1);            // Forgot to call EndDragDropTarget() ?
    if (type != NULL && !payload.IsDataType(type))
        return NULL;

    // Accept smallest drag target bounding box, this allows us to nest drag targets conveniently without ordering constraints.
    // NB: We currently accept NULL id as target. However, overlapping targets requires a unique ID to function!
    const bool was_accepted_previously = (g.DragDropAcceptIdPrev == g.DragDropTargetId);
    ImRect r = g.DragDropTargetRect;
    float r_surface = r.GetWidth() * r.GetHeight();
    if (r_surface <= g.DragDropAcceptIdCurrRectSurface)
    {
        g.DragDropAcceptFlags = flags;
        g.DragDropAcceptIdCurr = g.DragDropTargetId;
        g.DragDropAcceptIdCurrRectSurface = r_surface;
    }

    // Render default drop visuals
    payload.Preview = was_accepted_previously;
    flags |= (g.DragDropSourceFlags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect); // Source can also inhibit the preview (useful for external sources that lives for 1 frame)
    if (!(flags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect) && payload.Preview)
    {
        // FIXME-DRAG: Settle on a proper default visuals for drop target.
        r.Expand(3.5f);
        bool push_clip_rect = !window->ClipRect.Contains(r);
        if (push_clip_rect) window->DrawList->PushClipRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1));
        window->DrawList->AddRect(r.Min, r.Max, GetColorU32(ImGuiCol_DragDropTarget), 0.0f, ~0, 2.0f);
        if (push_clip_rect) window->DrawList->PopClipRect();
    }

    g.DragDropAcceptFrameCount = g.FrameCount;
    payload.Delivery = was_accepted_previously && !IsMouseDown(g.DragDropMouseButton); // For extern drag sources affecting os window focus, it's easier to just test !IsMouseDown() instead of IsMouseReleased()
    if (!payload.Delivery && !(flags & ImGuiDragDropFlags_AcceptBeforeDelivery))
        return NULL;

    return &payload;
}